

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_bench.cc
# Opt level: O0

void print_db_stats(fdb_file_handle **dbfiles,int nfiles)

{
  StatAggregator *this;
  char *pcVar1;
  int in_ESI;
  long in_RDI;
  char *name;
  StatAggregator *sa;
  int nstats;
  fdb_latency_stat stat;
  fdb_status status;
  int j;
  int i;
  char *in_stack_00000078;
  int in_stack_00000084;
  char *in_stack_00000088;
  StatAggregator *in_stack_00000090;
  value_type *in_stack_ffffffffffffff88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  StatAggregator *in_stack_ffffffffffffffc0;
  fdb_latency_stat local_30;
  fdb_status local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  this = (StatAggregator *)operator_new(0x10);
  StatAggregator::StatAggregator
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  local_10 = 0;
  do {
    if (0x12 < local_10) {
      StatAggregator::aggregateAndPrintStats
                (in_stack_00000090,in_stack_00000088,in_stack_00000084,in_stack_00000078);
      if (this != (StatAggregator *)0x0) {
        StatAggregator::~StatAggregator(this);
        operator_delete(this);
      }
      return;
    }
    pcVar1 = fdb_latency_stat_name('\0');
    std::__cxx11::string::operator=((string *)this->t_stats[local_10],pcVar1);
    for (local_14 = 0; local_14 < local_c; local_14 = local_14 + 1) {
      memset(&local_30,0,0x18);
      local_18 = fdb_get_latency_stats
                           (*(fdb_file_handle **)(local_8 + (long)local_14 * 8),&local_30,
                            (fdb_latency_stat_type)local_10);
      if (local_18 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                      ,0x41,"void print_db_stats(fdb_file_handle **, int)");
      }
      if (local_30.lat_count != 0) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

void print_db_stats(fdb_file_handle **dbfiles, int nfiles) {

    int i, j;
    fdb_status status;
    fdb_latency_stat stat;
    int nstats = FDB_LATENCY_NUM_STATS;

    StatAggregator *sa = new StatAggregator(nstats, 1);

    for (i = 0; i < nstats; i++) {
        const char* name = fdb_latency_stat_name(i);
        sa->t_stats[i][0].name = name;

        for (j = 0; j < nfiles; j++) {
            memset(&stat, 0, sizeof(fdb_latency_stat));
            status = fdb_get_latency_stats(dbfiles[j], &stat, i);
            assert(status == FDB_RESULT_SUCCESS);

            if (stat.lat_count > 0) {
                sa->t_stats[i][0].latencies.push_back(stat.lat_avg);
            }
        }
    }
    (void)status;

    sa->aggregateAndPrintStats("FDB_STATS", nfiles, "ms");
    delete sa;
}